

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * Catch::operator+[abi_cxx11_(StringRef lhs,StringRef rhs)

{
  StringRef rhs_00;
  StringRef rhs_01;
  char *pcVar1;
  string *in_RDI;
  string *ret;
  string *psVar2;
  StringRef local_28;
  StringRef local_18;
  
  psVar2 = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  pcVar1 = (char *)StringRef::size(&local_18);
  StringRef::size(&local_28);
  std::__cxx11::string::reserve((ulong)psVar2);
  rhs_00.m_size = (size_type)psVar2;
  rhs_00.m_start = pcVar1;
  operator+=(in_RDI,rhs_00);
  rhs_01.m_size = (size_type)psVar2;
  rhs_01.m_start = pcVar1;
  operator+=(in_RDI,rhs_01);
  return in_RDI;
}

Assistant:

std::string operator+(StringRef lhs, StringRef rhs) {
        std::string ret;
        ret.reserve(lhs.size() + rhs.size());
        ret += lhs;
        ret += rhs;
        return ret;
    }